

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O1

BBox<2> * Omega_h::find_bounding_box<2>(BBox<2> *__return_storage_ptr__,Reals *coords)

{
  int *piVar1;
  Int i;
  long lVar2;
  ulong uVar3;
  BBox<2> init;
  Alloc *local_50;
  Alloc *local_40;
  undefined8 local_30 [4];
  
  local_50 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_50 & 1) == 0) {
    uVar3 = local_50->size;
  }
  else {
    uVar3 = (ulong)local_50 >> 3;
  }
  if (((uint)uVar3 >> 3 & 1) == 0) {
    lVar2 = 0;
    do {
      local_30[lVar2] = 0x7fefffffffffffff;
      local_30[lVar2 + 2] = 0xffefffffffffffff;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    local_40 = local_50;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
              (__return_storage_ptr__,(Omega_h *)0x0,(int)(uVar3 >> 3) >> 1);
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      piVar1 = &local_40->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40);
        operator_delete(local_40,0x48);
      }
    }
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      piVar1 = &local_50->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_50);
        operator_delete(local_50,0x48);
      }
    }
    return __return_storage_ptr__;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}